

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testIncorrectGetTerritoryCode(char *tcAlpha)

{
  Territory TVar1;
  Territory ccode;
  char *tcAlpha_local;
  
  TVar1 = getTerritoryCode(tcAlpha,TERRITORY_NONE);
  if (_TERRITORY_MIN < TVar1) {
    foundError();
    printf("*** ERROR *** getTerritoryCode returns \'%d\' (should be < 0) for territory code \'%s\'\n"
           ,(ulong)(uint)TVar1,tcAlpha);
  }
  return 1;
}

Assistant:

static int testIncorrectGetTerritoryCode(char *tcAlpha) {
    enum Territory ccode = getTerritoryCode(tcAlpha, TERRITORY_NONE);
    if (ccode > _TERRITORY_MIN) {
        foundError();
        printf("*** ERROR *** getTerritoryCode returns '%d' (should be < 0) for territory code '%s'\n", (int) ccode,
               tcAlpha);
    }
    return 1;
}